

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall onmt::TokensBuilder::safe_append(TokensBuilder *this,CharInfo *character)

{
  int *piVar1;
  
  if (this->_no_substitution == false) {
    for (piVar1 = substitutes_abi_cxx11_; piVar1 != DAT_003c0890; piVar1 = piVar1 + 10) {
      if (*piVar1 == character->value) {
        append(this,(string *)(piVar1 + 2));
        return;
      }
    }
  }
  append(this,character);
  return;
}

Assistant:

void safe_append(const unicode::CharInfo& character)
    {
      if (!_no_substitution)
      {
        for (const auto& pair : substitutes)
        {
          if (pair.first == character.value)
          {
            append(pair.second);
            return;
          }
        }
      }

      append(character);
    }